

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O3

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::CommittedShaderResources::Set
          (CommittedShaderResources *this,Uint32 Index,ShaderResourceBindingImplType *pSRB)

{
  byte bVar1;
  __int_type_conflict2 _Var2;
  char (*in_RCX) [32];
  ShaderResourceCacheImplType *pSVar3;
  string msg;
  string local_48;
  
  if (7 < Index) {
    FormatString<char[26],char[32]>
              (&local_48,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x7f6489,in_RCX);
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"Set",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x182);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  if (pSRB == (ShaderResourceBindingImplType *)0x0) {
    (this->ResourceCaches)._M_elems[Index] = (ShaderResourceCacheVk *)0x0;
    bVar1 = ~(byte)(1 << ((byte)Index & 0x1f));
    this->StaleSRBMask = this->StaleSRBMask & bVar1;
    pSVar3 = (ShaderResourceCacheImplType *)0x0;
LAB_00294cdb:
    this->DynamicSRBMask = this->DynamicSRBMask & bVar1;
    RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl>::operator=
              ((this->SRBs)._M_elems + Index,pSRB);
    if (pSRB == (ShaderResourceBindingImplType *)0x0) {
      _Var2 = 0;
      goto LAB_00294d0c;
    }
  }
  else {
    pSVar3 = &(pSRB->super_ShaderResourceBindingBase<Diligent::EngineVkImplTraits>).
              m_ShaderResourceCache;
    (this->ResourceCaches)._M_elems[Index] = pSVar3;
    bVar1 = (byte)(1 << ((byte)Index & 0x1f));
    this->StaleSRBMask = this->StaleSRBMask | bVar1;
    if ((pSRB->super_ShaderResourceBindingBase<Diligent::EngineVkImplTraits>).m_ShaderResourceCache.
        m_NumDynamicBuffers == 0) {
      bVar1 = ~bVar1;
      goto LAB_00294cdb;
    }
    this->DynamicSRBMask = this->DynamicSRBMask | bVar1;
    RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl>::operator=
              ((this->SRBs)._M_elems + Index,pSRB);
  }
  this->ResourcesValidated = false;
  _Var2 = (pSVar3->super_ShaderResourceCacheBase).m_DvpRevision.super___atomic_base<unsigned_int>.
          _M_i;
LAB_00294d0c:
  (this->CacheRevisions)._M_elems[Index] = _Var2;
  return;
}

Assistant:

void Set(Uint32 Index, ShaderResourceBindingImplType* pSRB)
        {
            VERIFY_EXPR(Index < MAX_RESOURCE_SIGNATURES);
            ShaderResourceCacheImplType* pResourceCache = pSRB != nullptr ? &pSRB->GetResourceCache() : nullptr;
            ResourceCaches[Index]                       = pResourceCache;

            const SRBMaskType SRBBit = static_cast<SRBMaskType>(1u << Index);
            if (pResourceCache != nullptr)
                StaleSRBMask |= SRBBit;
            else
                StaleSRBMask &= ~SRBBit;

            if (pResourceCache != nullptr && pResourceCache->HasDynamicResources())
                DynamicSRBMask |= SRBBit;
            else
                DynamicSRBMask &= ~SRBBit;

#ifdef DILIGENT_DEVELOPMENT
            SRBs[Index] = pSRB;
            if (pSRB != nullptr)
                ResourcesValidated = false;
            CacheRevisions[Index] = pResourceCache != nullptr ? pResourceCache->DvpGetRevision() : 0;
#endif
        }